

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O2

void __thiscall
tonk::gateway::StateMachine::OnXMLResponse(StateMachine *this,ParsedURL *sourceUrl,ParsedXML *xml)

{
  ostringstream *poVar1;
  uint uVar2;
  int iVar3;
  OutputWorker *pOVar4;
  ostream *poVar5;
  pointer pCVar6;
  ulong uVar7;
  Result result;
  ParsedURL url;
  ControlEndpoint control;
  stringstream full;
  undefined1 local_3f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8 [4];
  string local_3a8 [32];
  anon_union_16_3_a3f0114d_for___in6_u local_388 [4];
  undefined1 local_340 [392];
  undefined1 local_1b8 [392];
  
  ParsedURL::ParsedURL((ParsedURL *)(local_3f8 + 0x10),sourceUrl);
  if ((xml->URLBase)._M_string_length != 0) {
    ParsedURL::Parse((ParsedURL *)local_3f8,(string *)(local_3f8 + 0x10));
    if ((ErrorResult *)local_3f8._0_8_ != (ErrorResult *)0x0) {
      Result::ToJson_abi_cxx11_((string *)local_1b8,(Result *)local_3f8);
      if (DAT_001d8d30 < 5) {
        poVar1 = (ostringstream *)(local_340 + 0x10);
        local_340._0_8_ = ModuleLogger;
        local_340._8_4_ = Error;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,(string *)&DAT_001d8d60);
        std::operator<<((ostream *)poVar1,"Failed to parse URLBase: ");
        std::operator<<((ostream *)poVar1,(string *)local_1b8);
        pOVar4 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_340);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
      }
      std::__cxx11::string::~string((string *)local_1b8);
      Result::~Result((Result *)local_3f8);
      goto LAB_00160a15;
    }
    Result::~Result((Result *)local_3f8);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  poVar5 = std::operator<<((ostream *)(local_1b8 + 0x10),(string *)(local_3f8 + 0x50));
  poVar5 = std::operator<<(poVar5,":");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_388[0].__u6_addr16[0]);
  std::operator<<(poVar5,(string *)&xml->ControlURL);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)(local_3f8 + 0x10),(string *)local_340);
  std::__cxx11::string::~string((string *)local_340);
  local_3f8._8_8_ = &this->ControlEndpoints;
  pCVar6 = (this->ControlEndpoints).
           super__Vector_base<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = (uint)(((long)(this->ControlEndpoints).
                        super__Vector_base<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar6) / 0x128);
  for (uVar7 = 0; (~((int)uVar2 >> 0x1f) & uVar2) != uVar7; uVar7 = uVar7 + 1) {
    iVar3 = strcasecmp((char *)local_3e8[0]._0_8_,(pCVar6->URL).FullURL._M_dataplus._M_p);
    if (iVar3 == 0) {
      pCVar6->EndpointActive = true;
      BeginControlSOAPRequests(this,(int)uVar7);
      goto LAB_00160a08;
    }
    pCVar6 = pCVar6 + 1;
  }
  if (DAT_001d8d30 < 3) {
    poVar1 = (ostringstream *)(local_340 + 0x10);
    local_340._0_8_ = ModuleLogger;
    local_340._8_4_ = Info;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,(string *)&DAT_001d8d60);
    std::operator<<((ostream *)poVar1,"Found control endpoint via gateway: ");
    std::operator<<((ostream *)poVar1,(string *)(local_3f8 + 0x10));
    pOVar4 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_340);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  ControlEndpoint::ControlEndpoint((ControlEndpoint *)local_340);
  ParsedURL::operator=((ParsedURL *)local_340,(ParsedURL *)(local_3f8 + 0x10));
  ParsedXML::operator=((ParsedXML *)(local_340 + 0xa8),xml);
  std::vector<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>::
  push_back((vector<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>
             *)local_3f8._8_8_,(value_type *)local_340);
  BeginControlSOAPRequests
            (this,(int)(((long)(this->ControlEndpoints).
                               super__Vector_base<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->ControlEndpoints).
                              super__Vector_base<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x128) + -1);
  ControlEndpoint::~ControlEndpoint((ControlEndpoint *)local_340);
LAB_00160a08:
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
LAB_00160a15:
  ParsedURL::~ParsedURL((ParsedURL *)(local_3f8 + 0x10));
  return;
}

Assistant:

void StateMachine::OnXMLResponse(const ParsedURL& sourceUrl, const ParsedXML& xml)
{
    // Default to using the source host/port
    ParsedURL url = sourceUrl;

    // But if a URLBase is specified, then use that
    if (!xml.URLBase.empty())
    {
        Result result = url.Parse(xml.URLBase);
        if (result.IsFail()) {
            ModuleLogger.Error("Failed to parse URLBase: ", result.ToJson());
            return;
        }
    }

    // Fix up the FullURL before using it to compare URLs
    std::stringstream full;
    full << url.IP << ":" << url.Port << xml.ControlURL;
    url.FullURL = full.str();

    // Find it if it is already in the list
    const int controlCount = (int)ControlEndpoints.size();
    for (int controlIndex = 0; controlIndex < controlCount; ++controlIndex)
    {
        auto& control = ControlEndpoints[controlIndex];

        // If the control URL was found:
        if (control.URL == url)
        {
            // Reactivate endpoint if it is found again on the LAN.
            // This is helpful if we leave and rejoin the same LAN
            control.EndpointActive = true;

            BeginControlSOAPRequests(controlIndex);

            return;
        }
    }

    ModuleLogger.Info("Found control endpoint via gateway: ", url.FullURL);

    ControlEndpoint control;
    control.URL = url;
    control.XML = xml;

    ControlEndpoints.push_back(control);
    const int controlIndex = (int)ControlEndpoints.size() - 1;

    BeginControlSOAPRequests(controlIndex);
}